

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O1

void __thiscall
MacProj::set_outflow_bcs
          (MacProj *this,int level,MultiFab *mac_phi,MultiFab *param_3,MultiFab *param_4,
          MultiFab *param_5)

{
  AmrLevel *pAVar1;
  pointer pGVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  IndexType IVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Box *pBVar16;
  BoxArray *pBVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  IntVect hi;
  Box phiBox;
  bool hasOutFlow;
  int numOutFlowFaces;
  BoxList phiBoxList;
  BoxList ccBoxList;
  BoxArray uncovered_outflow_ba;
  MFIter mfi;
  Orientation outFaces [6];
  Box local_248;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_228;
  IndexType IStack_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  IndexType IStack_210;
  uint local_200;
  bool local_1f9;
  BoxArray *local_1f8;
  int local_1ec;
  IntVect *local_1e8;
  long local_1e0;
  FabArrayBase *local_1d8;
  ulong local_1d0;
  uint local_1c8;
  BoxList local_1c0;
  BoxList local_1a0;
  _Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_180;
  undefined4 local_178;
  int local_174 [15];
  element_type *local_138;
  MFIter local_118;
  Orientation local_b8 [4];
  undefined8 local_a8;
  BoxArray local_98;
  
  local_b8[0].val = -1;
  local_b8[1].val = 0xffffffff;
  local_b8[2].val = 0xffffffff;
  local_b8[3].val = 0xffffffff;
  local_a8 = 0xffffffffffffffff;
  local_1d8 = (FabArrayBase *)mac_phi;
  OutFlowBC::GetOutFlowFaces(&local_1f9,local_b8,this->phys_bc,&local_1ec);
  pAVar1 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
           super__Vector_impl_data._M_start[level];
  pGVar2 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  amrex::BoxList::BoxList(&local_1a0);
  amrex::BoxList::BoxList(&local_1c0);
  if (local_1ec < 1) {
    local_200 = 0;
LAB_0037251d:
    if (local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      amrex::BoxArray::BoxArray((BoxArray *)&local_180,&local_1c0);
      amrex::BoxList::clear(&local_1c0);
      if (0 < (int)local_200) {
        local_1f8 = (BoxArray *)(ulong)local_200;
        pBVar17 = (BoxArray *)0x0;
        do {
          amrex::MFIter::MFIter(&local_118,local_1d8,'\0');
          while (local_118.currentIndex < local_118.endIndex) {
            piVar5 = &local_118.currentIndex;
            if (local_118.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar5 = ((local_118.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + local_118.currentIndex;
            }
            lVar11 = *(long *)(*(long *)((long)&local_1d8[1].boxarray.m_bat.m_op + 0xc) +
                              (long)*piVar5 * 8);
            amrex::BATransformer::operator()
                      (&local_248,(BATransformer *)&local_180,
                       (local_138->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)pBVar17);
            IStack_220.itype = (uint)*(undefined8 *)(lVar11 + 0x20);
            iStack_21c = (int)*(undefined8 *)(lVar11 + 0x24);
            iStack_218 = (int)((ulong)*(undefined8 *)(lVar11 + 0x24) >> 0x20);
            local_228._M_head_impl._0_4_ = (int)*(undefined8 *)(lVar11 + 0x18);
            local_228._M_head_impl._4_4_ = (int)((ulong)*(undefined8 *)(lVar11 + 0x18) >> 0x20);
            iVar19 = local_248.smallend.vect[0];
            if (local_248.smallend.vect[0] < (int)local_228._M_head_impl) {
              iVar19 = (int)local_228._M_head_impl;
            }
            iVar3 = local_248.smallend.vect[1];
            if (local_248.smallend.vect[1] < local_228._M_head_impl._4_4_) {
              iVar3 = local_228._M_head_impl._4_4_;
            }
            local_228._M_head_impl._4_4_ = iVar3;
            local_228._M_head_impl._0_4_ = iVar19;
            IVar10.itype = local_248.smallend.vect[2];
            if (local_248.smallend.vect[2] < (int)IStack_220.itype) {
              IVar10.itype = IStack_220.itype;
            }
            IStack_220.itype = IVar10.itype;
            iVar15 = local_248.bigend.vect[0];
            if (iStack_21c < local_248.bigend.vect[0]) {
              iVar15 = iStack_21c;
            }
            iStack_21c = iVar15;
            iVar13 = local_248.bigend.vect[1];
            if (iStack_218 < local_248.bigend.vect[1]) {
              iVar13 = iStack_218;
            }
            iStack_218 = iVar13;
            iStack_214 = (int)*(undefined8 *)(lVar11 + 0x2c);
            iVar14 = local_248.bigend.vect[2];
            if (iStack_214 < local_248.bigend.vect[2]) {
              iVar14 = iStack_214;
            }
            IStack_210.itype = (uint)((ulong)*(undefined8 *)(lVar11 + 0x2c) >> 0x20);
            iStack_214 = iVar14;
            if ((((iVar19 <= iVar15) && (iVar3 <= iVar13)) && ((int)IVar10.itype <= iVar14)) &&
               (IStack_210.itype < 8)) {
              piVar5 = &local_118.currentIndex;
              if (local_118.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar5 = ((local_118.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_118.currentIndex;
              }
              local_248.smallend.vect[0] = 0;
              local_248.smallend.vect[1] = 0;
              amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                        (*(BaseFab<double> **)
                          (*(long *)((long)&local_1d8[1].boxarray.m_bat.m_op + 0xc) +
                          (long)*piVar5 * 8),(double *)&local_248,(Box *)&local_228,(DestComp)0x0,
                         (NumComps)0x1);
            }
            amrex::MFIter::operator++(&local_118);
          }
          amrex::MFIter::~MFIter(&local_118);
          pBVar17 = (BoxArray *)((long)&(pBVar17->m_bat).m_bat_type + 1);
        } while (pBVar17 != local_1f8);
      }
      amrex::BoxArray::~BoxArray((BoxArray *)&local_180);
    }
    if (local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start != (Box *)0x0) {
      operator_delete(local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  local_1f8 = &pAVar1->grids;
  pBVar16 = (Box *)((long)(pGVar2 + level) + 0xac);
  local_1e8 = (IntVect *)((long)(pGVar2 + level) + 0xb8);
  lVar11 = 0;
  local_200 = 0;
LAB_00371f52:
  local_1e0 = lVar11;
  iVar19 = local_b8[lVar11].val % 3;
  if ((local_b8[lVar11].val < 3) &&
     (plVar4 = (long *)(pAVar1->grids).m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     plVar4[1] != *plVar4 && -1 < plVar4[1] - *plVar4)) {
    lVar11 = 0;
    lVar18 = 0;
    do {
      amrex::BATransformer::operator()
                ((Box *)&local_180,&local_1f8->m_bat,(Box *)(*plVar4 + lVar11));
      if (*(int *)((long)&local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                  + (long)iVar19 * 4) == *(int *)((long)&pBVar16->smallend + (long)iVar19 * 4))
      goto LAB_00372085;
      lVar18 = lVar18 + 1;
      plVar4 = (long *)(pAVar1->grids).m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar7 = (plVar4[1] - *plVar4 >> 2) * 0x6db6db6db6db6db7;
      lVar11 = lVar11 + 0x1c;
    } while (lVar7 - lVar18 != 0 && lVar18 <= lVar7);
  }
  lVar11 = local_1e0;
  if ((2 < local_b8[local_1e0].val) &&
     (plVar4 = (long *)(pAVar1->grids).m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     plVar4[1] != *plVar4 && -1 < plVar4[1] - *plVar4)) {
    lVar7 = 0;
    lVar18 = 0;
    do {
      amrex::BATransformer::operator()((Box *)&local_180,&local_1f8->m_bat,(Box *)(*plVar4 + lVar7))
      ;
      if (local_174[iVar19] == *(int *)((long)(pGVar2 + level) + 0xb8U + (long)iVar19 * 4))
      goto LAB_00372085;
      lVar18 = lVar18 + 1;
      plVar4 = (long *)(pAVar1->grids).m_ref.
                       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar8 = (plVar4[1] - *plVar4 >> 2) * 0x6db6db6db6db6db7;
      lVar7 = lVar7 + 0x1c;
      lVar11 = local_1e0;
    } while (lVar8 - lVar18 != 0 && lVar18 <= lVar8);
  }
  goto LAB_00372502;
LAB_00372085:
  lVar11 = local_1e0;
  uVar6 = local_b8[local_1e0].val % 3;
  local_118.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x100000001;
  local_118.fabArray._0_4_ = 1;
  local_118.fabArray._4_4_ = 0;
  local_118.tile_size.vect[0] = 0;
  local_118.tile_size.vect[1] = 0;
  local_118.tile_size.vect[2] = 0;
  if (local_b8[local_1e0].val - 3U < 3) {
    IStack_220.itype = *(uint *)((long)(pGVar2 + level) + 0xb4);
    local_228._M_head_impl = *(FabArrayBase **)&pBVar16->smallend;
    local_248.smallend.vect[2] = *(int *)((long)local_1e8->vect + 8);
    local_248.smallend.vect._0_8_ = *(undefined8 *)local_1e8->vect;
    IVar10.itype = *(uint *)((long)(pGVar2 + level) + 0xc4);
    local_1d0 = CONCAT44(IVar10.itype >> 1,IVar10.itype) & 0x100000001;
    local_1c8 = IVar10.itype >> 2 & 1;
    uVar9 = (ulong)uVar6;
    iVar19 = local_248.smallend.vect[uVar9];
    uVar12 = ~*(uint *)((long)&local_1d0 + uVar9 * 4) & 1;
    *(uint *)((long)&local_228._M_head_impl + uVar9 * 4) = uVar12 + iVar19;
    local_248.smallend.vect[uVar9] = uVar12 + iVar19 + 1;
    local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_228._M_head_impl;
    local_178 = IStack_220.itype;
    local_174[2] = local_248.smallend.vect[2];
    local_174[0] = local_248.smallend.vect[0];
    local_174[1] = local_248.smallend.vect[1];
    local_118.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )local_228._M_head_impl;
    local_118.fabArray._0_4_ = IStack_220.itype;
    local_118.fabArray._4_4_ = local_174[0];
    local_118.tile_size.vect[0] = local_174[1];
    local_118.tile_size.vect[1] = local_248.smallend.vect[2];
    local_118.tile_size.vect[2] = IVar10.itype & ~(1 << (uVar6 & 0x1f));
    iVar19 = -2;
  }
  else {
    IStack_220.itype = *(uint *)((long)(pGVar2 + level) + 0xb4);
    local_228._M_head_impl = *(FabArrayBase **)&pBVar16->smallend;
    local_248.smallend.vect[2] = *(int *)((long)local_1e8->vect + 8);
    local_248.smallend.vect._0_8_ = *(undefined8 *)local_1e8->vect;
    uVar9 = (ulong)(int)uVar6;
    iVar19 = *(int *)((long)&local_228._M_head_impl + uVar9 * 4);
    *(int *)((long)&local_228._M_head_impl + uVar9 * 4) = iVar19 + -2;
    local_248.smallend.vect[uVar9] = iVar19 + -1;
    local_178 = IStack_220.itype;
    local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_228._M_head_impl;
    local_174[2] = local_248.smallend.vect[2];
    local_174[0] = local_248.smallend.vect[0];
    local_174[1] = local_248.smallend.vect[1];
    local_118.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )local_228._M_head_impl;
    local_118.fabArray._0_4_ = IStack_220.itype;
    local_118.fabArray._4_4_ = local_174[0];
    local_118.tile_size.vect[0] = local_174[1];
    local_118.tile_size.vect[1] = local_248.smallend.vect[2];
    local_118.tile_size.vect[2] = *(uint *)((long)(pGVar2 + level) + 0xc4) & ~(1 << (uVar6 & 0x1f));
    iVar19 = 2;
  }
  piVar5 = local_118.tile_size.vect + (uVar9 - 4);
  local_118.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       local_228._M_head_impl;
  local_118.fabArray._0_4_ = IStack_220.itype;
  local_118.fabArray._4_4_ = local_174[0];
  local_118.tile_size.vect[0] = local_174[1];
  local_118.tile_size.vect[1] = local_248.smallend.vect[2];
  *piVar5 = *piVar5 + iVar19;
  piVar5 = local_118.tile_size.vect + (uVar9 - 1);
  *piVar5 = *piVar5 + iVar19;
  local_174[2] = local_248.smallend.vect[2];
  if (local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
         (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_228._M_head_impl;
    local_178 = IStack_220.itype;
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_1a0,
               (iterator)
               local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,(Box *)&local_118);
  }
  else {
    *(ulong *)((local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish)->bigend).vect =
         CONCAT44(local_118.tile_size.vect[0],local_118.fabArray._4_4_);
    *(ulong *)(((local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->bigend).vect + 2) =
         CONCAT44(local_118.tile_size.vect[2],local_118.tile_size.vect[1]);
    *(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true> *)
     ((local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->smallend).vect =
         local_118.m_fa._M_t.
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    *(ulong *)(((local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect + 2) =
         CONCAT44(local_118.fabArray._4_4_,local_118.fabArray._0_4_);
    local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_1a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  uVar6 = local_b8[lVar11].val % 3;
  local_178 = *(uint *)((long)(pGVar2 + level) + 0xb4);
  local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)*(FabArrayBase **)&pBVar16->smallend;
  local_248.smallend.vect[2] = *(int *)((long)local_1e8->vect + 8);
  local_248.smallend.vect._0_8_ = *(undefined8 *)local_1e8->vect;
  if (local_b8[lVar11].val < 3) {
    uVar9 = (ulong)(int)uVar6;
    iVar19 = *(int *)((long)&local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                             _M_head_impl + uVar9 * 4) + -1;
  }
  else {
    IVar10.itype = *(uint *)((long)(pGVar2 + level) + 0xc4);
    local_1d0 = CONCAT44(IVar10.itype >> 1,IVar10.itype) & 0x100000001;
    local_1c8 = IVar10.itype >> 2 & 1;
    uVar9 = (ulong)uVar6;
    iVar19 = (~*(uint *)((long)&local_1d0 + uVar9 * 4) & 1) + local_248.smallend.vect[uVar9];
  }
  *(int *)((long)&local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
          uVar9 * 4) = iVar19;
  local_248.smallend.vect[uVar9] = iVar19;
  IStack_220.itype = local_178;
  local_228 = local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  iStack_21c = local_248.smallend.vect[0];
  iStack_218 = local_248.smallend.vect[1];
  IStack_210.itype = *(uint *)((long)(pGVar2 + level) + 0xc4) & ~(1 << (uVar6 & 0x1f));
  iStack_214 = local_248.smallend.vect[2];
  if (local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_1c0,
               (iterator)
               local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish,(Box *)&local_228);
  }
  else {
    *(undefined8 *)
     ((local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->bigend).vect = local_248.smallend.vect._0_8_;
    *(undefined8 *)
     (((local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish)->bigend).vect + 2) = _iStack_214;
    *(_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
     ((local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish)->smallend).vect =
         local_180.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    *(ulong *)(((local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect + 2) =
         CONCAT44(iStack_21c,local_178);
    local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_1c0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_248.smallend.vect[0] =
       (int)local_118.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  iVar19 = (pBVar16->smallend).vect[0];
  if ((pBVar16->smallend).vect[0] < local_248.smallend.vect[0]) {
    iVar19 = local_248.smallend.vect[0];
  }
  local_248.smallend.vect[1] =
       local_118.m_fa._M_t.
       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
       super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_;
  iVar3 = *(int *)((long)(pGVar2 + level) + 0xb0);
  if (*(int *)((long)(pGVar2 + level) + 0xb0) < local_248.smallend.vect[1]) {
    iVar3 = local_248.smallend.vect[1];
  }
  local_248.smallend.vect[1] = iVar3;
  local_248.smallend.vect[0] = iVar19;
  local_248.smallend.vect[2] = *(uint *)((long)(pGVar2 + level) + 0xb4);
  if ((int)*(uint *)((long)(pGVar2 + level) + 0xb4) < (int)local_118.fabArray._0_4_) {
    local_248.smallend.vect[2] = local_118.fabArray._0_4_;
  }
  local_248.bigend.vect[0] = *(int *)((long)(pGVar2 + level) + 0xb8);
  if (local_118.fabArray._4_4_ < *(int *)((long)(pGVar2 + level) + 0xb8)) {
    local_248.bigend.vect[0] = local_118.fabArray._4_4_;
  }
  local_248.bigend.vect[1] = *(int *)((long)(pGVar2 + level) + 0xbc);
  if (local_118.tile_size.vect[0] < *(int *)((long)(pGVar2 + level) + 0xbc)) {
    local_248.bigend.vect[1] = local_118.tile_size.vect[0];
  }
  local_248.bigend.vect[2] = *(int *)((long)(pGVar2 + level) + 0xc0);
  if (local_118.tile_size.vect[1] < *(int *)((long)(pGVar2 + level) + 0xc0)) {
    local_248.bigend.vect[2] = local_118.tile_size.vect[1];
  }
  local_248.btype.itype = local_118.tile_size.vect[2];
  amrex::complementIn((BoxArray *)&local_180,&local_248,local_1f8);
  if ((local_138->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (local_138->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    bVar20 = false;
  }
  else {
    amrex::intersect(&local_98,local_1f8,&local_248,0);
    bVar20 = ((local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             ((local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start;
    amrex::BoxArray::~BoxArray(&local_98);
  }
  if (bVar20) {
    amrex::Error_host("MacProj: Cannot yet handle partially refined outflow");
  }
  local_200 = local_200 + 1;
  amrex::BoxArray::~BoxArray((BoxArray *)&local_180);
LAB_00372502:
  lVar11 = lVar11 + 1;
  if (local_1ec <= lVar11) goto LAB_0037251d;
  goto LAB_00371f52;
}

Assistant:

void
MacProj::set_outflow_bcs (int             level,
                          MultiFab*       mac_phi,
                          const MultiFab* /*u_mac*/,
                          const MultiFab& /*S*/,
                          const MultiFab& /*divu*/)
{
    //
    // This code is very similar to the outflow BC stuff in the Projection
    // class except that here the the phi to be solved for lives on the
    // out-directed faces.  The projection equation to satisfy is
    //
    //   (1/r)(d/dr)[r/rho dphi/dr] = dv/dr - S
    //
    bool hasOutFlow;
    Orientation outFaces[2*BL_SPACEDIM];
    int numOutFlowFaces;

    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFaces);

    const BoxArray&   grids  = LevelData[level]->boxArray();
    const Geometry&   geom   = parent->Geom(level);
    const Box&        domain = parent->Geom(level).Domain();
    //
    // Create 1-wide cc box just outside boundary to hold phi.
    //
    BoxList ccBoxList, phiBoxList;
    // numOutFlowFaces gives the number of outflow faces on the entire
    //   problem domain
    // nOutFlowTouched gives the number of outflow faces a level touches, so
    //   nOutFlowTouched = numOutFlowFaces for level 0, but
    //   nOutFlowTouched <= numOutFlowFaces for levels > 0, since
    //   finer levels may not span the entire problem domain
    int nOutFlowTouched = 0;
    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
        if (grids_on_side_of_domain(grids,geom.Domain(),outFaces[iface]))
        {
            nOutFlowTouched++;
            const int outDir    = outFaces[iface].coordDir();

            Box ccBndBox;
            if (outFaces[iface].faceDir() == Orientation::high)
            {
                ccBndBox = amrex::adjCellHi(domain,outDir,2);
                ccBndBox.shift(outDir,-2);
            }
            else
            {
                ccBndBox = amrex::adjCellLo(domain,outDir,2);
                ccBndBox.shift(outDir,2);
            }
            ccBoxList.push_back(ccBndBox);

            Box phiBox  = amrex::adjCell(domain,outFaces[iface],1);
            phiBoxList.push_back(phiBox);

            const Box&     valid_ccBndBox       = ccBndBox & domain;
            const BoxArray uncovered_outflow_ba = amrex::complementIn(valid_ccBndBox,grids);

            if (uncovered_outflow_ba.size() &&
                amrex::intersect(grids,valid_ccBndBox).size())
                amrex::Error("MacProj: Cannot yet handle partially refined outflow");
        }
    }

    if ( !ccBoxList.isEmpty() )
    {
        BoxArray phiBoxArray(phiBoxList);
        phiBoxList.clear();

        //
        // Must do this kind of copy instead of mac_phi->copy(phidat);
        // because we're copying onto the ghost cells of the FABs,
        // not the valid regions.
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for ( int iface = 0; iface < nOutFlowTouched; ++iface )
        {
            for (MFIter mfi(*mac_phi); mfi.isValid(); ++mfi)
            {
                Box ovlp = (*mac_phi)[mfi].box() & phiBoxArray[iface];
                if (ovlp.ok()) {
                      (*mac_phi)[mfi].setVal<RunOn::Gpu>(0,ovlp,0,1);
                }
            }
        }
    }
}